

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O0

PolyNf * Inferences::PolynomialEvaluation::
         simplifySummation<Kernel::NumTraits<Kernel::RealConstantType>>
                   (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *summands,
                   bool removeZeros)

{
  bool bVar1;
  uint uVar2;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *pPVar3;
  size_t sVar4;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar5;
  byte in_DL;
  __off_t __length;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_RSI;
  PolyNf *in_RDI;
  Polynom poly;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  factors;
  Numeral numeral;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  uint i;
  int offs;
  undefined4 in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffd70;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffd78;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *x;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  MonomFactor *in_stack_fffffffffffffd88;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffd90;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffda8;
  RealConstantType *in_stack_fffffffffffffdb0;
  RealConstantType *in_stack_fffffffffffffdb8;
  bool local_239;
  bool local_229;
  bool local_209;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_fffffffffffffe08;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> local_1c8 [2];
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_180 [2];
  undefined4 local_160;
  byte local_159;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_138 [6];
  byte local_d1;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_90 [4];
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_50;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_30;
  uint local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::begin(in_RSI);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::end(in_RSI);
  std::sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*>
            ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
            );
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    this = (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)(ulong)local_1c;
    pPVar3 = (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size(in_RSI);
    if (pPVar3 <= this) break;
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
              (in_RSI,(ulong)local_1c);
    in_stack_fffffffffffffe08 = &local_50;
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    Kernel::RealConstantType::RealConstantType
              (&in_stack_fffffffffffffd70->numeral,
               (RealConstantType *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
    ::Perfect(local_90,&local_30);
    while( true ) {
      uVar2 = local_1c + 1;
      sVar4 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size(in_RSI)
      ;
      local_209 = false;
      if (uVar2 < sVar4) {
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                  (in_RSI,(ulong)(local_1c + 1));
        local_209 = Lib::operator==((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                                     *)in_stack_fffffffffffffd70,
                                    (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                                     *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
                                   );
      }
      if (local_209 == false) break;
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                (in_RSI,(ulong)(local_1c + 1));
      Kernel::RealConstantType::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      Kernel::RealConstantType::operator=
                (&in_stack_fffffffffffffd70->numeral,
                 (RealConstantType *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x80b009);
      local_1c = local_1c + 1;
    }
    local_d1 = 0;
    local_229 = true;
    if ((local_11 & 1) != 0) {
      Kernel::NumTraits<Kernel::RealConstantType>::constant(in_stack_fffffffffffffd6c);
      local_d1 = 1;
      local_229 = Kernel::RationalConstantType::operator!=
                            ((RationalConstantType *)in_stack_fffffffffffffd70,
                             (RationalConstantType *)
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    if ((local_d1 & 1) != 0) {
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x80b0f0);
    }
    if (local_229 != false) {
      Kernel::RealConstantType::RealConstantType
                (&in_stack_fffffffffffffd70->numeral,
                 (RealConstantType *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      Lib::
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
      ::Perfect(local_138,local_90);
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                (in_stack_fffffffffffffd90,(Numeral *)in_stack_fffffffffffffd88,
                 (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                  *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      sVar4 = (size_t)local_18;
      local_18 = local_18 + 1;
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                (in_RSI,sVar4);
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::operator=
                (in_stack_fffffffffffffd70,
                 (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x80b192);
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x80b19f);
    }
    Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x80b223);
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x80b230);
    local_1c = local_1c + 1;
  }
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::truncate
            (in_RSI,(char *)(long)local_18,__length);
  sVar4 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size(in_RSI);
  local_159 = 0;
  local_239 = false;
  if (sVar4 == 1) {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[](in_RSI,0);
    Kernel::RealConstantType::RealConstantType
              (&in_stack_fffffffffffffd70->numeral,
               (RealConstantType *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_159 = 1;
    local_160 = 1;
    bVar1 = Kernel::operator==(in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8);
    local_239 = false;
    if (bVar1) {
      pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                         (in_RSI,0);
      in_stack_fffffffffffffda8 =
           Lib::
           Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
           ::operator->(&pMVar5->factors);
      uVar2 = Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::nFactors
                        ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x80b33e);
      local_239 = false;
      if (uVar2 == 1) {
        pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
                 operator[](in_RSI,0);
        in_stack_fffffffffffffd90 =
             (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             Lib::
             Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
             ::operator->(&pMVar5->factors);
        in_stack_fffffffffffffd88 =
             Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::factorAt
                       ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                        in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
        local_239 = in_stack_fffffffffffffd88->power == 1;
      }
    }
  }
  if ((local_159 & 1) != 0) {
    Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x80b3c4);
  }
  if ((local_239 & 1U) == 0) {
    x = local_180;
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              (this,in_stack_fffffffffffffe08);
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::integrity
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)x);
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              (local_1c8,
               (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffffda8);
    Kernel::AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::RealConstantType>>
              ((AnyPoly *)CONCAT17(local_239,in_stack_fffffffffffffd80),x);
    Kernel::PolyNf::PolyNf((PolyNf *)in_stack_fffffffffffffd90,(AnyPoly *)in_stack_fffffffffffffd88)
    ;
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x80b4cb);
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x80b4d8);
  }
  else {
    pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator[]
                       (in_RSI,0);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(&pMVar5->factors);
    Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::factorAt
              ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    Kernel::PolyNf::PolyNf
              ((PolyNf *)in_stack_fffffffffffffd70,
               (PolyNf *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  return in_RDI;
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}